

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.cpp
# Opt level: O2

int __thiscall ncnn::Power::forward_inplace(Power *this,Mat *bottom_top_blob,Option *opt)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  void *pvVar5;
  int i;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  float fVar9;
  
  uVar7 = bottom_top_blob->h * bottom_top_blob->w;
  pvVar5 = bottom_top_blob->data;
  sVar1 = bottom_top_blob->cstep;
  uVar4 = 0;
  uVar8 = (ulong)uVar7;
  if ((int)uVar7 < 1) {
    uVar8 = uVar4;
  }
  uVar3 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar3 = uVar4;
  }
  sVar2 = bottom_top_blob->elemsize;
  for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
    for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      fVar9 = powf(this->scale * *(float *)((long)pvVar5 + uVar6 * 4) + this->shift,this->power);
      *(float *)((long)pvVar5 + uVar6 * 4) = fVar9;
    }
    pvVar5 = (void *)((long)pvVar5 + sVar1 * sVar2);
  }
  return 0;
}

Assistant:

int Power::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            ptr[i] = powf((shift + ptr[i] * scale), power);
        }
    }

    return 0;
}